

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_1fe6b52::WriterSpy::~WriterSpy(WriterSpy *this)

{
  ~WriterSpy(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

WriterSpy(const std::shared_ptr<dap::Writer>& w,
            const std::shared_ptr<dap::Writer>& s,
            const std::string& prefix)
      : w(w), s(s), prefix(prefix) {}